

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int iter_config(void *user,char *section,char *name,char *value)

{
  int iVar1;
  void *__buf;
  bool bVar2;
  bool bVar3;
  
  iVar1 = strcmp(section,"resolver");
  if (iVar1 == 0) {
    iVar1 = strcmp(name,"bind-addr");
    if (iVar1 == 0) {
      strncpy((char *)((long)user + 0x110),value,0x100);
    }
    iVar1 = strcmp(name,"bind-port");
    if (iVar1 != 0) goto LAB_0010b28f;
    iVar1 = atoi(value);
    *(int *)((long)user + 0x210) = iVar1;
LAB_0010b3b6:
    bVar2 = 0 < iVar1;
  }
  else {
LAB_0010b28f:
    iVar1 = strcmp(section,"i2cp");
    if (iVar1 == 0) {
      iVar1 = strcmp(name,"enabled");
      if (iVar1 == 0) {
        if (*value == '1') {
          bVar2 = value[1] == '\0';
        }
        else {
          bVar2 = false;
        }
        *(bool *)((long)user + 0x318) = bVar2;
      }
      iVar1 = strcmp(name,"addr");
      if (iVar1 == 0) {
        strncpy((char *)((long)user + 0x214),value,0x100);
      }
      iVar1 = strcmp(name,"port");
      if (iVar1 == 0) {
        iVar1 = atoi(value);
        *(int *)((long)user + 0x314) = iVar1;
        goto LAB_0010b3b6;
      }
    }
    iVar1 = strcmp(section,"netif");
    bVar2 = true;
    if (iVar1 != 0) goto LAB_0010b3e3;
    iVar1 = strcmp(name,"enabled");
    if (iVar1 == 0) {
      if (*value == '1') {
        bVar3 = value[1] == '\0';
      }
      else {
        bVar3 = false;
      }
      *(bool *)((long)user + 0x10c) = bVar3;
    }
    iVar1 = strcmp(name,"addr");
    if (iVar1 == 0) {
      __buf = (void *)((long)user + 0x104);
    }
    else {
      iVar1 = strcmp(name,"netmask");
      if (iVar1 != 0) {
        iVar1 = strcmp(name,"mtu");
        if (iVar1 != 0) goto LAB_0010b3e3;
        iVar1 = atoi(value);
        *(int *)((long)user + 0x100) = iVar1;
        goto LAB_0010b3b6;
      }
      __buf = (void *)((long)user + 0x108);
    }
    iVar1 = inet_pton(2,value,__buf);
    bVar2 = iVar1 != -1;
  }
LAB_0010b3e3:
  return (int)bVar2;
}

Assistant:

int iter_config(void * user, const char * section, const char * name, const char * value)
{
  struct trans2p_config * config = user;
  if(!strcmp(section, "resolver"))
  {
    if(!strcmp(name, "bind-addr"))
    {
      strncpy(config->dns.addr, value, sizeof(config->dns.addr));
    }
    if(!strcmp(name, "bind-port"))
    {
      config->dns.port = atoi(value);
      return config->dns.port > 0;
    }
  }
  if(!strcmp(section, "i2cp"))
  {
    if(!strcmp(name, "enabled"))
    {
      config->i2cp.enabled = strcmp(value, "1") == 0;
    }
    if(!strcmp(name, "addr"))
    {
      strncpy(config->i2cp.addr, value, sizeof(config->i2cp.addr));
    }
    if(!strcmp(name, "port"))
    {
      config->i2cp.port = atoi(value);
      return config->i2cp.port > 0;
    }
  }
  if(!strcmp(section, "netif"))
  {
    if(!strcmp(name, "enabled"))
    {
      config->tun.enabled = strcmp(value, "1") == 0;
    }
    if(!strcmp(name, "addr"))
    {
      return inet_pton(AF_INET, value, &config->tun.addr) != -1;
    }
    if(!strcmp(name, "netmask"))
    {
      return inet_pton(AF_INET, value, &config->tun.netmask) != -1;
    }
    if(!strcmp(name, "mtu"))
    {
      config->tun.mtu = atoi(value);
      return config->tun.mtu > 0;
    }
  }
  return 1;
}